

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  byte bVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  size_t sVar35;
  char cVar36;
  bool bVar37;
  AABBNodeMB4D *node1;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar41;
  NodeRef root;
  size_t sVar42;
  byte bVar43;
  undefined4 uVar44;
  NodeRef *pNVar45;
  uint uVar46;
  byte bVar47;
  byte bVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar66;
  vint4 bi_13;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar72;
  vint4 ai_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai_3;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 bi;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi_3;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  vint4 bi_2;
  float fVar93;
  vfloat4 a0;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 ai;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  uint local_36d4;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar51;
  int iVar67;
  int iVar68;
  int iVar69;
  
  bvh = (BVH *)This->ptr;
  sVar42 = (bvh->root).ptr;
  if (sVar42 != 8) {
    auVar57 = *(undefined1 (*) [16])(ray + 0x80);
    auVar54 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar28 = ZEXT812(0) << 0x20;
    auVar55 = ZEXT816(0) << 0x40;
    uVar9 = vcmpps_avx512vl(auVar57,auVar55,5);
    uVar49 = vpcmpeqd_avx512vl(auVar54,(undefined1  [16])valid_i->field_0);
    uVar49 = ((byte)uVar9 & 0xf) & uVar49;
    bVar47 = (byte)uVar49;
    if (bVar47 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar52._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar52._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar52._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar52._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar53 = vfmadd231ps_fma(auVar52,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vfmadd231ps_fma(auVar53,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar52 = vrsqrt14ps_avx512vl(auVar53);
      auVar56._8_4_ = 0xbf000000;
      auVar56._0_8_ = 0xbf000000bf000000;
      auVar56._12_4_ = 0xbf000000;
      auVar53 = vmulps_avx512vl(auVar53,auVar56);
      fVar90 = auVar52._0_4_;
      fVar91 = auVar52._4_4_;
      fVar92 = auVar52._8_4_;
      fVar93 = auVar52._12_4_;
      auVar58._0_4_ = fVar90 * fVar90 * fVar90 * auVar53._0_4_;
      auVar58._4_4_ = fVar91 * fVar91 * fVar91 * auVar53._4_4_;
      auVar58._8_4_ = fVar92 * fVar92 * fVar92 * auVar53._8_4_;
      auVar58._12_4_ = fVar93 * fVar93 * fVar93 * auVar53._12_4_;
      auVar53._8_4_ = 0x3fc00000;
      auVar53._0_8_ = 0x3fc000003fc00000;
      auVar53._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar58,auVar52,auVar53);
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      uVar39 = uVar49;
      while (uVar39 != 0) {
        lVar40 = 0;
        for (uVar50 = uVar39; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar39 = uVar39 - 1 & uVar39;
        uVar50 = (ulong)(uint)((int)lVar40 * 4);
        auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar50 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar50 + 0x50)),0x1c);
        auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + uVar50 + 0x60)),0x28);
        fVar90 = *(float *)((long)pre.ray_space + (uVar50 - 0x10));
        auVar64._0_4_ = auVar53._0_4_ * fVar90;
        auVar64._4_4_ = auVar53._4_4_ * fVar90;
        auVar64._8_4_ = auVar53._8_4_ * fVar90;
        auVar64._12_4_ = auVar53._12_4_ * fVar90;
        auVar56 = vshufpd_avx(auVar64,auVar64,1);
        auVar53 = vmovshdup_avx(auVar64);
        auVar100._0_4_ = auVar53._0_4_ ^ 0x80000000;
        auVar53 = vunpckhps_avx(auVar64,auVar55);
        auVar100._4_12_ = auVar28;
        auVar58 = vshufps_avx(auVar53,auVar100,0x41);
        auVar96._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar96._8_8_ = auVar56._8_8_ ^ auVar59._8_8_;
        auVar53 = vdpps_avx(auVar58,auVar58,0x7f);
        auVar52 = vinsertps_avx(auVar96,auVar64,0x2a);
        auVar56 = vdpps_avx(auVar52,auVar52,0x7f);
        uVar9 = vcmpps_avx512vl(auVar56,auVar53,1);
        auVar53 = vpmovm2d_avx512vl(uVar9);
        auVar103._0_4_ = auVar53._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        uVar50 = vpmovd2m_avx512vl(auVar103);
        auVar63._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * auVar54._4_4_;
        auVar63._0_4_ = (uint)((byte)uVar50 & 1) * auVar54._0_4_;
        auVar63._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * auVar54._8_4_;
        auVar63._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * auVar54._12_4_;
        auVar53 = vblendvps_avx(auVar52,auVar58,auVar63);
        auVar56 = vdpps_avx(auVar53,auVar53,0x7f);
        auVar104._4_12_ = auVar28;
        auVar104._0_4_ = auVar56._0_4_;
        auVar52 = vrsqrt14ss_avx512f(auVar55,auVar104);
        fVar91 = auVar52._0_4_;
        fVar91 = fVar91 * 1.5 - auVar56._0_4_ * 0.5 * fVar91 * fVar91 * fVar91;
        auVar97._0_4_ = auVar53._0_4_ * fVar91;
        auVar97._4_4_ = auVar53._4_4_ * fVar91;
        auVar97._8_4_ = auVar53._8_4_ * fVar91;
        auVar97._12_4_ = auVar53._12_4_ * fVar91;
        auVar53 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar56 = vshufps_avx(auVar64,auVar64,0xc9);
        auVar105._0_4_ = auVar97._0_4_ * auVar56._0_4_;
        auVar105._4_4_ = auVar97._4_4_ * auVar56._4_4_;
        auVar105._8_4_ = auVar97._8_4_ * auVar56._8_4_;
        auVar105._12_4_ = auVar97._12_4_ * auVar56._12_4_;
        auVar53 = vfmsub231ps_fma(auVar105,auVar64,auVar53);
        auVar56 = vshufps_avx(auVar53,auVar53,0xc9);
        auVar53 = vdpps_avx(auVar56,auVar56,0x7f);
        auVar106._4_12_ = auVar28;
        auVar106._0_4_ = auVar53._0_4_;
        auVar52 = vrsqrt14ss_avx512f(auVar55,auVar106);
        fVar91 = auVar52._0_4_;
        fVar91 = fVar91 * 1.5 - auVar53._0_4_ * 0.5 * fVar91 * fVar91 * fVar91;
        auVar101._0_4_ = fVar91 * auVar56._0_4_;
        auVar101._4_4_ = fVar91 * auVar56._4_4_;
        auVar101._8_4_ = fVar91 * auVar56._8_4_;
        auVar101._12_4_ = fVar91 * auVar56._12_4_;
        auVar65._0_4_ = fVar90 * auVar64._0_4_;
        auVar65._4_4_ = fVar90 * auVar64._4_4_;
        auVar65._8_4_ = fVar90 * auVar64._8_4_;
        auVar65._12_4_ = fVar90 * auVar64._12_4_;
        auVar52 = vunpcklps_avx(auVar97,auVar65);
        auVar53 = vunpckhps_avx(auVar97,auVar65);
        auVar58 = vunpcklps_avx(auVar101,auVar55);
        auVar56 = vunpckhps_avx(auVar101,auVar55);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar56);
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar52,auVar58);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar52,auVar58);
        pre.ray_space[lVar40].vx.field_0 = aVar8;
        pre.ray_space[lVar40].vy.field_0 = aVar6;
        pre.ray_space[lVar40].vz.field_0 = aVar7;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar109 = ZEXT1664(auVar54);
      auVar55 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar54);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar110 = ZEXT1664(auVar53);
      uVar39 = vcmpps_avx512vl(auVar55,auVar53,1);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = ZEXT1664(auVar55);
      auVar56 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar52 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar54);
      uVar50 = vcmpps_avx512vl(auVar52,auVar53,1);
      auVar52 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar54);
      uVar10 = vcmpps_avx512vl(auVar54,auVar53,1);
      auVar54 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar37 = (bool)((byte)uVar39 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar56._0_4_;
      bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar56._4_4_;
      bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar56._8_4_;
      bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar56._12_4_;
      bVar37 = (bool)((byte)uVar50 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar52._0_4_;
      bVar37 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar52._4_4_;
      bVar37 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar52._8_4_;
      bVar37 = (bool)((byte)(uVar50 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar52._12_4_;
      bVar37 = (bool)((byte)uVar10 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar54._0_4_;
      bVar37 = (bool)((byte)(uVar10 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar54._4_4_;
      bVar37 = (bool)((byte)(uVar10 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar54._8_4_;
      bVar37 = (bool)((byte)(uVar10 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar37 * 0x5d5e0b6b | (uint)!bVar37 * auVar54._12_4_;
      auVar54 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar112 = ZEXT1664(auVar54);
      uVar39 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar54,1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar55._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar39 & 1) * auVar55._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar55._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar55._12_4_;
      uVar39 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar54,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar37 = (bool)((byte)uVar39 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar37 * auVar55._0_4_ | (uint)!bVar37 * 0x60;
      bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * 0x60;
      bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * 0x60;
      bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * 0x60;
      uVar39 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar54,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar37 = (bool)((byte)uVar39 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar37 * auVar55._0_4_ | (uint)!bVar37 * 0xa0;
      bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * 0xa0;
      bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * 0xa0;
      bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar113 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar47 & 1) * auVar55._0_4_ |
           (uint)!(bool)(bVar47 & 1) * stack_near[0].field_0._0_4_;
      bVar37 = (bool)((byte)(uVar49 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * stack_near[0].field_0._4_4_;
      bVar37 = (bool)((byte)(uVar49 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * stack_near[0].field_0._8_4_;
      bVar37 = SUB81(uVar49 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * stack_near[0].field_0._12_4_;
      auVar57 = vmaxps_avx512vl(auVar57,auVar54);
      tray.tfar.field_0.i[0] =
           (uint)(bVar47 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar47 & 1) * -0x800000;
      bVar37 = (bool)((byte)(uVar49 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar37 * auVar57._4_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar49 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar37 * auVar57._8_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = SUB81(uVar49 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar37 * auVar57._12_4_ | (uint)!bVar37 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar46 = 3;
      }
      else {
        uVar46 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_36d4 = (ushort)uVar49 ^ 0xf;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar41 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar42;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar114 = ZEXT1664(auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar115 = ZEXT1664(auVar57);
LAB_01d83520:
      do {
        do {
          root.ptr = pNVar45[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d83c2f;
          pNVar45 = pNVar45 + -1;
          vVar1.field_0 =
               *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                ((vfloat<4> *)paVar41)[-1].field_0.v;
          auVar116 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar41 = &((vfloat<4> *)paVar41)[-1].field_0;
          uVar49 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar49 == '\0');
        uVar44 = (undefined4)uVar49;
        if (uVar46 < (uint)POPCOUNT(uVar44)) {
LAB_01d83569:
          do {
            lVar40 = -0x20;
            sVar42 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d83c2f;
              uVar9 = vcmpps_avx512vl(auVar116._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar9 != '\0') {
                bVar48 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar3 = This->leafIntersector;
                uVar49 = (ulong)(~(byte)local_36d4 & 0xf);
                bVar43 = 0;
                while (uVar49 != 0) {
                  lVar40 = 0;
                  for (uVar39 = uVar49; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    lVar40 = lVar40 + 1;
                  }
                  uVar49 = uVar49 - 1 & uVar49;
                  cVar36 = (**(code **)((long)pvVar3 + (ulong)bVar48 * 0x40 + 0x18))
                                     (&pre,ray,lVar40,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar27 = (byte)(1 << ((uint)lVar40 & 0x1f));
                  if (cVar36 == '\0') {
                    bVar27 = 0;
                  }
                  bVar43 = bVar43 | bVar27;
                }
                bVar43 = (byte)local_36d4 | bVar43;
                local_36d4 = (uint)bVar43;
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar109 = ZEXT1664(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar110 = ZEXT1664(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar111 = ZEXT1664(auVar57);
                auVar57 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
                auVar112 = ZEXT1664(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar113 = ZEXT1664(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar114 = ZEXT1664(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar115 = ZEXT1664(auVar57);
                if (bVar43 == 0xf) {
                  local_36d4._0_1_ = 0xf;
                  goto LAB_01d83c2f;
                }
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar37 = (bool)(bVar43 >> 1 & 1);
                bVar4 = (bool)(bVar43 >> 2 & 1);
                bVar5 = (bool)(bVar43 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar37 * auVar57._4_4_ | (uint)!bVar37 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar43 & 1) * auVar57._0_4_ |
                     (uint)!(bool)(bVar43 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar4 * auVar57._8_4_ | (uint)!bVar4 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar5 * auVar57._12_4_ | (uint)!bVar5 * tray.tfar.field_0.i[3];
              }
              goto LAB_01d83520;
            }
            uVar9 = vcmpps_avx512vl(auVar116._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar49 = root.ptr & 0xfffffffffffffff0;
            uVar38 = (uint)root.ptr & 7;
            aVar72 = auVar113._0_16_;
            for (; (auVar116 = ZEXT1664((undefined1  [16])aVar72), lVar40 != 0 &&
                   (sVar2 = *(size_t *)(uVar49 + 0x40 + lVar40 * 2), sVar2 != 8));
                lVar40 = lVar40 + 4) {
              if ((uVar38 == 6) || (uVar38 == 1)) {
                uVar44 = *(undefined4 *)(uVar49 + 0x120 + lVar40);
                auVar73._4_4_ = uVar44;
                auVar73._0_4_ = uVar44;
                auVar73._8_4_ = uVar44;
                auVar73._12_4_ = uVar44;
                auVar57 = *(undefined1 (*) [16])(ray + 0x70);
                uVar44 = *(undefined4 *)(uVar49 + 0x60 + lVar40);
                auVar54._4_4_ = uVar44;
                auVar54._0_4_ = uVar44;
                auVar54._8_4_ = uVar44;
                auVar54._12_4_ = uVar44;
                auVar54 = vfmadd213ps_avx512vl(auVar73,auVar57,auVar54);
                uVar44 = *(undefined4 *)(uVar49 + 0x160 + lVar40);
                auVar75._4_4_ = uVar44;
                auVar75._0_4_ = uVar44;
                auVar75._8_4_ = uVar44;
                auVar75._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xa0 + lVar40);
                auVar55._4_4_ = uVar44;
                auVar55._0_4_ = uVar44;
                auVar55._8_4_ = uVar44;
                auVar55._12_4_ = uVar44;
                auVar55 = vfmadd213ps_avx512vl(auVar75,auVar57,auVar55);
                uVar44 = *(undefined4 *)(uVar49 + 0x1a0 + lVar40);
                auVar78._4_4_ = uVar44;
                auVar78._0_4_ = uVar44;
                auVar78._8_4_ = uVar44;
                auVar78._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xe0 + lVar40);
                auVar13._4_4_ = uVar44;
                auVar13._0_4_ = uVar44;
                auVar13._8_4_ = uVar44;
                auVar13._12_4_ = uVar44;
                auVar53 = vfmadd213ps_avx512vl(auVar78,auVar57,auVar13);
                uVar44 = *(undefined4 *)(uVar49 + 0x140 + lVar40);
                auVar81._4_4_ = uVar44;
                auVar81._0_4_ = uVar44;
                auVar81._8_4_ = uVar44;
                auVar81._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x80 + lVar40);
                auVar14._4_4_ = uVar44;
                auVar14._0_4_ = uVar44;
                auVar14._8_4_ = uVar44;
                auVar14._12_4_ = uVar44;
                auVar56 = vfmadd213ps_avx512vl(auVar81,auVar57,auVar14);
                uVar44 = *(undefined4 *)(uVar49 + 0x180 + lVar40);
                auVar84._4_4_ = uVar44;
                auVar84._0_4_ = uVar44;
                auVar84._8_4_ = uVar44;
                auVar84._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xc0 + lVar40);
                auVar15._4_4_ = uVar44;
                auVar15._0_4_ = uVar44;
                auVar15._8_4_ = uVar44;
                auVar15._12_4_ = uVar44;
                auVar52 = vfmadd213ps_avx512vl(auVar84,auVar57,auVar15);
                uVar44 = *(undefined4 *)(uVar49 + 0x1c0 + lVar40);
                auVar88._4_4_ = uVar44;
                auVar88._0_4_ = uVar44;
                auVar88._8_4_ = uVar44;
                auVar88._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x100 + lVar40);
                auVar16._4_4_ = uVar44;
                auVar16._0_4_ = uVar44;
                auVar16._8_4_ = uVar44;
                auVar16._12_4_ = uVar44;
                auVar58 = vfmadd213ps_avx512vl(auVar88,auVar57,auVar16);
                auVar29._8_8_ = tray.org.field_0._8_8_;
                auVar29._0_8_ = tray.org.field_0._0_8_;
                auVar31._8_8_ = tray.org.field_0._24_8_;
                auVar31._0_8_ = tray.org.field_0._16_8_;
                auVar33._8_8_ = tray.org.field_0._40_8_;
                auVar33._0_8_ = tray.org.field_0._32_8_;
                auVar54 = vsubps_avx(auVar54,auVar29);
                auVar98._0_4_ = tray.rdir.field_0._0_4_ * auVar54._0_4_;
                auVar98._4_4_ = tray.rdir.field_0._4_4_ * auVar54._4_4_;
                auVar98._8_4_ = tray.rdir.field_0._8_4_ * auVar54._8_4_;
                auVar98._12_4_ = tray.rdir.field_0._12_4_ * auVar54._12_4_;
                auVar54 = vsubps_avx(auVar55,auVar31);
                auVar76._0_4_ = auVar54._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar76._4_4_ = auVar54._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar76._8_4_ = auVar54._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar76._12_4_ = auVar54._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar54 = vsubps_avx(auVar53,auVar33);
                auVar79._0_4_ = tray.rdir.field_0._32_4_ * auVar54._0_4_;
                auVar79._4_4_ = tray.rdir.field_0._36_4_ * auVar54._4_4_;
                auVar79._8_4_ = tray.rdir.field_0._40_4_ * auVar54._8_4_;
                auVar79._12_4_ = tray.rdir.field_0._44_4_ * auVar54._12_4_;
                auVar54 = vsubps_avx(auVar56,auVar29);
                auVar82._0_4_ = tray.rdir.field_0._0_4_ * auVar54._0_4_;
                auVar82._4_4_ = tray.rdir.field_0._4_4_ * auVar54._4_4_;
                auVar82._8_4_ = tray.rdir.field_0._8_4_ * auVar54._8_4_;
                auVar82._12_4_ = tray.rdir.field_0._12_4_ * auVar54._12_4_;
                auVar54 = vsubps_avx(auVar52,auVar31);
                auVar85._0_4_ = auVar54._0_4_ * (float)tray.rdir.field_0._16_4_;
                auVar85._4_4_ = auVar54._4_4_ * (float)tray.rdir.field_0._20_4_;
                auVar85._8_4_ = auVar54._8_4_ * (float)tray.rdir.field_0._24_4_;
                auVar85._12_4_ = auVar54._12_4_ * (float)tray.rdir.field_0._28_4_;
                auVar54 = vsubps_avx(auVar58,auVar33);
                auVar89._0_4_ = tray.rdir.field_0._32_4_ * auVar54._0_4_;
                auVar89._4_4_ = tray.rdir.field_0._36_4_ * auVar54._4_4_;
                auVar89._8_4_ = tray.rdir.field_0._40_4_ * auVar54._8_4_;
                auVar89._12_4_ = tray.rdir.field_0._44_4_ * auVar54._12_4_;
                auVar54 = vpminsd_avx(auVar98,auVar82);
                auVar55 = vpminsd_avx(auVar76,auVar85);
                auVar54 = vpmaxsd_avx(auVar54,auVar55);
                auVar55 = vpminsd_avx(auVar79,auVar89);
                auVar54 = vpmaxsd_avx(auVar54,auVar55);
                auVar53 = vmulps_avx512vl(auVar54,auVar114._0_16_);
                auVar54 = vpmaxsd_avx(auVar98,auVar82);
                auVar55 = vpmaxsd_avx(auVar76,auVar85);
                auVar55 = vpminsd_avx(auVar54,auVar55);
                auVar54 = vpmaxsd_avx(auVar79,auVar89);
                auVar54 = vpminsd_avx(auVar55,auVar54);
                auVar55 = vmulps_avx512vl(auVar54,auVar115._0_16_);
                auVar54 = vpmaxsd_avx(auVar53,(undefined1  [16])tray.tnear.field_0);
                auVar55 = vpminsd_avx(auVar55,(undefined1  [16])tray.tfar.field_0);
                uVar11 = vcmpps_avx512vl(auVar54,auVar55,2);
                bVar48 = (byte)uVar11;
                if (uVar38 == 6) {
                  uVar44 = *(undefined4 *)(uVar49 + 0x200 + lVar40);
                  auVar17._4_4_ = uVar44;
                  auVar17._0_4_ = uVar44;
                  auVar17._8_4_ = uVar44;
                  auVar17._12_4_ = uVar44;
                  uVar11 = vcmpps_avx512vl(auVar57,auVar17,1);
                  uVar44 = *(undefined4 *)(uVar49 + 0x1e0 + lVar40);
                  auVar18._4_4_ = uVar44;
                  auVar18._0_4_ = uVar44;
                  auVar18._8_4_ = uVar44;
                  auVar18._12_4_ = uVar44;
                  uVar12 = vcmpps_avx512vl(auVar57,auVar18,0xd);
                  bVar48 = (byte)uVar11 & (byte)uVar12 & bVar48;
                }
              }
              else {
                uVar44 = *(undefined4 *)(uVar49 + 0x60 + lVar40);
                auVar86._4_4_ = uVar44;
                auVar86._0_4_ = uVar44;
                auVar86._8_4_ = uVar44;
                auVar86._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x80 + lVar40);
                auVar83._4_4_ = uVar44;
                auVar83._0_4_ = uVar44;
                auVar83._8_4_ = uVar44;
                auVar83._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xa0 + lVar40);
                auVar80._4_4_ = uVar44;
                auVar80._0_4_ = uVar44;
                auVar80._8_4_ = uVar44;
                auVar80._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xc0 + lVar40);
                auVar99._4_4_ = uVar44;
                auVar99._0_4_ = uVar44;
                auVar99._8_4_ = uVar44;
                auVar99._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0xe0 + lVar40);
                auVar95._4_4_ = uVar44;
                auVar95._0_4_ = uVar44;
                auVar95._8_4_ = uVar44;
                auVar95._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x100 + lVar40);
                auVar94._4_4_ = uVar44;
                auVar94._0_4_ = uVar44;
                auVar94._8_4_ = uVar44;
                auVar94._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x120 + lVar40);
                auVar77._4_4_ = uVar44;
                auVar77._0_4_ = uVar44;
                auVar77._8_4_ = uVar44;
                auVar77._12_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar49 + 0x140 + lVar40);
                auVar74._4_4_ = uVar44;
                auVar74._0_4_ = uVar44;
                auVar74._8_4_ = uVar44;
                auVar74._12_4_ = uVar44;
                fVar90 = *(float *)(uVar49 + 0x160 + lVar40);
                auVar70._4_4_ = fVar90;
                auVar70._0_4_ = fVar90;
                auVar70._8_4_ = fVar90;
                auVar70._12_4_ = fVar90;
                auVar57 = *(undefined1 (*) [16])(ray + 0x70);
                auVar65 = auVar111._0_16_;
                auVar54 = vsubps_avx512vl(auVar65,auVar57);
                uVar44 = *(undefined4 *)(uVar49 + 0x1e0 + lVar40);
                auVar19._4_4_ = uVar44;
                auVar19._0_4_ = uVar44;
                auVar19._8_4_ = uVar44;
                auVar19._12_4_ = uVar44;
                auVar55 = vmulps_avx512vl(auVar57,auVar19);
                uVar44 = *(undefined4 *)(uVar49 + 0x200 + lVar40);
                auVar20._4_4_ = uVar44;
                auVar20._0_4_ = uVar44;
                auVar20._8_4_ = uVar44;
                auVar20._12_4_ = uVar44;
                auVar53 = vmulps_avx512vl(auVar57,auVar20);
                uVar44 = *(undefined4 *)(uVar49 + 0x220 + lVar40);
                auVar21._4_4_ = uVar44;
                auVar21._0_4_ = uVar44;
                auVar21._8_4_ = uVar44;
                auVar21._12_4_ = uVar44;
                auVar56 = vmulps_avx512vl(auVar57,auVar21);
                auVar59 = auVar112._0_16_;
                auVar55 = vfmadd231ps_avx512vl(auVar55,auVar54,auVar59);
                auVar53 = vfmadd231ps_avx512vl(auVar53,auVar54,auVar59);
                uVar44 = *(undefined4 *)(uVar49 + 0x240 + lVar40);
                auVar22._4_4_ = uVar44;
                auVar22._0_4_ = uVar44;
                auVar22._8_4_ = uVar44;
                auVar22._12_4_ = uVar44;
                auVar52 = vmulps_avx512vl(auVar57,auVar22);
                uVar44 = *(undefined4 *)(uVar49 + 0x260 + lVar40);
                auVar23._4_4_ = uVar44;
                auVar23._0_4_ = uVar44;
                auVar23._8_4_ = uVar44;
                auVar23._12_4_ = uVar44;
                auVar58 = vmulps_avx512vl(auVar57,auVar23);
                uVar44 = *(undefined4 *)(uVar49 + 0x280 + lVar40);
                auVar24._4_4_ = uVar44;
                auVar24._0_4_ = uVar44;
                auVar24._8_4_ = uVar44;
                auVar24._12_4_ = uVar44;
                auVar57 = vmulps_avx512vl(auVar57,auVar24);
                auVar56 = vfmadd231ps_avx512vl(auVar56,auVar54,auVar59);
                auVar107._0_4_ = auVar54._0_4_ + auVar52._0_4_;
                auVar107._4_4_ = auVar54._4_4_ + auVar52._4_4_;
                auVar107._8_4_ = auVar54._8_4_ + auVar52._8_4_;
                auVar107._12_4_ = auVar54._12_4_ + auVar52._12_4_;
                auVar52 = vaddps_avx512vl(auVar54,auVar58);
                auVar102._0_4_ = auVar54._0_4_ + auVar57._0_4_;
                auVar102._4_4_ = auVar54._4_4_ + auVar57._4_4_;
                auVar102._8_4_ = auVar54._8_4_ + auVar57._8_4_;
                auVar102._12_4_ = auVar54._12_4_ + auVar57._12_4_;
                auVar30._8_8_ = tray.org.field_0._8_8_;
                auVar30._0_8_ = tray.org.field_0._0_8_;
                auVar32._8_8_ = tray.org.field_0._24_8_;
                auVar32._0_8_ = tray.org.field_0._16_8_;
                auVar34._8_8_ = tray.org.field_0._40_8_;
                auVar34._0_8_ = tray.org.field_0._32_8_;
                auVar57 = vmulps_avx512vl(auVar77,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar54 = vmulps_avx512vl(auVar74,(undefined1  [16])
                                                  tray.dir.field_0.field_0.z.field_0);
                auVar108._0_4_ = tray.dir.field_0._32_4_ * fVar90;
                auVar108._4_4_ = tray.dir.field_0._36_4_ * fVar90;
                auVar108._8_4_ = tray.dir.field_0._40_4_ * fVar90;
                auVar108._12_4_ = tray.dir.field_0._44_4_ * fVar90;
                auVar57 = vfmadd231ps_avx512vl
                                    (auVar57,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar99);
                auVar54 = vfmadd231ps_avx512vl
                                    (auVar54,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar95);
                auVar58 = vfmadd231ps_avx512vl
                                    (auVar108,auVar94,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar57 = vfmadd231ps_avx512vl
                                    (auVar57,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar86);
                auVar54 = vfmadd231ps_avx512vl
                                    (auVar54,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar83);
                auVar58 = vfmadd231ps_avx512vl
                                    (auVar58,auVar80,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar63 = auVar109._0_16_;
                auVar59 = vandps_avx512vl(auVar57,auVar63);
                auVar64 = auVar110._0_16_;
                uVar39 = vcmpps_avx512vl(auVar59,auVar64,1);
                bVar37 = (bool)((byte)uVar39 & 1);
                iVar51 = auVar110._0_4_;
                auVar60._0_4_ = (uint)bVar37 * iVar51 | (uint)!bVar37 * auVar57._0_4_;
                bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
                iVar67 = auVar110._4_4_;
                auVar60._4_4_ = (uint)bVar37 * iVar67 | (uint)!bVar37 * auVar57._4_4_;
                bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
                iVar68 = auVar110._8_4_;
                iVar69 = auVar110._12_4_;
                auVar60._8_4_ = (uint)bVar37 * iVar68 | (uint)!bVar37 * auVar57._8_4_;
                bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
                auVar60._12_4_ = (uint)bVar37 * iVar69 | (uint)!bVar37 * auVar57._12_4_;
                auVar57 = vandps_avx512vl(auVar54,auVar63);
                uVar39 = vcmpps_avx512vl(auVar57,auVar64,1);
                bVar37 = (bool)((byte)uVar39 & 1);
                auVar61._0_4_ = (uint)bVar37 * iVar51 | (uint)!bVar37 * auVar54._0_4_;
                bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar37 * iVar67 | (uint)!bVar37 * auVar54._4_4_;
                bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar37 * iVar68 | (uint)!bVar37 * auVar54._8_4_;
                bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
                auVar61._12_4_ = (uint)bVar37 * iVar69 | (uint)!bVar37 * auVar54._12_4_;
                auVar57 = vandps_avx512vl(auVar58,auVar63);
                uVar39 = vcmpps_avx512vl(auVar57,auVar64,1);
                bVar37 = (bool)((byte)uVar39 & 1);
                auVar62._0_4_ = (uint)bVar37 * iVar51 | (uint)!bVar37 * auVar58._0_4_;
                bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar62._4_4_ = (uint)bVar37 * iVar67 | (uint)!bVar37 * auVar58._4_4_;
                bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar62._8_4_ = (uint)bVar37 * iVar68 | (uint)!bVar37 * auVar58._8_4_;
                bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
                auVar62._12_4_ = (uint)bVar37 * iVar69 | (uint)!bVar37 * auVar58._12_4_;
                auVar57 = vrcp14ps_avx512vl(auVar60);
                auVar54 = vfnmadd213ps_avx512vl(auVar60,auVar57,auVar65);
                auVar54 = vfmadd132ps_avx512vl(auVar54,auVar57,auVar57);
                auVar57 = vrcp14ps_avx512vl(auVar61);
                auVar58 = vfnmadd213ps_avx512vl(auVar61,auVar57,auVar65);
                auVar58 = vfmadd132ps_avx512vl(auVar58,auVar57,auVar57);
                auVar59 = vrcp14ps_avx512vl(auVar62);
                auVar63 = vfnmadd213ps_avx512vl(auVar62,auVar59,auVar65);
                uVar44 = *(undefined4 *)(uVar49 + 0x180 + lVar40);
                auVar57._4_4_ = uVar44;
                auVar57._0_4_ = uVar44;
                auVar57._8_4_ = uVar44;
                auVar57._12_4_ = uVar44;
                auVar57 = vfmadd213ps_avx512vl(auVar77,auVar34,auVar57);
                uVar44 = *(undefined4 *)(uVar49 + 0x1a0 + lVar40);
                auVar25._4_4_ = uVar44;
                auVar25._0_4_ = uVar44;
                auVar25._8_4_ = uVar44;
                auVar25._12_4_ = uVar44;
                auVar64 = vfmadd213ps_avx512vl(auVar74,auVar34,auVar25);
                uVar44 = *(undefined4 *)(uVar49 + 0x1c0 + lVar40);
                auVar26._4_4_ = uVar44;
                auVar26._0_4_ = uVar44;
                auVar26._8_4_ = uVar44;
                auVar26._12_4_ = uVar44;
                auVar65 = vfmadd213ps_avx512vl(auVar70,auVar34,auVar26);
                auVar59 = vfmadd132ps_avx512vl(auVar63,auVar59,auVar59);
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar32,auVar99);
                auVar63 = vfmadd231ps_avx512vl(auVar64,auVar32,auVar95);
                auVar64 = vfmadd231ps_avx512vl(auVar65,auVar32,auVar94);
                auVar65 = vfmadd231ps_avx512vl(auVar57,auVar30,auVar86);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar30,auVar83);
                auVar64 = vfmadd231ps_avx512vl(auVar64,auVar30,auVar80);
                auVar57 = vsubps_avx(auVar55,auVar65);
                auVar55 = vmulps_avx512vl(auVar54,auVar57);
                auVar57 = vsubps_avx(auVar53,auVar63);
                auVar53 = vmulps_avx512vl(auVar58,auVar57);
                auVar57 = vsubps_avx(auVar56,auVar64);
                auVar87._0_4_ = auVar59._0_4_ * auVar57._0_4_;
                auVar87._4_4_ = auVar59._4_4_ * auVar57._4_4_;
                auVar87._8_4_ = auVar59._8_4_ * auVar57._8_4_;
                auVar87._12_4_ = auVar59._12_4_ * auVar57._12_4_;
                auVar57 = vsubps_avx(auVar107,auVar65);
                auVar56 = vmulps_avx512vl(auVar54,auVar57);
                auVar57 = vsubps_avx(auVar52,auVar63);
                auVar52 = vmulps_avx512vl(auVar58,auVar57);
                auVar57 = vsubps_avx(auVar102,auVar64);
                auVar71._0_4_ = auVar59._0_4_ * auVar57._0_4_;
                auVar71._4_4_ = auVar59._4_4_ * auVar57._4_4_;
                auVar71._8_4_ = auVar59._8_4_ * auVar57._8_4_;
                auVar71._12_4_ = auVar59._12_4_ * auVar57._12_4_;
                auVar57 = vpminsd_avx(auVar55,auVar56);
                auVar54 = vpminsd_avx(auVar53,auVar52);
                auVar57 = vpmaxsd_avx(auVar57,auVar54);
                auVar54 = vpminsd_avx(auVar87,auVar71);
                auVar57 = vpmaxsd_avx(auVar57,auVar54);
                auVar54 = vpmaxsd_avx(auVar55,auVar56);
                auVar55 = vpmaxsd_avx(auVar53,auVar52);
                auVar55 = vpminsd_avx(auVar54,auVar55);
                auVar54 = vpmaxsd_avx(auVar87,auVar71);
                auVar54 = vpminsd_avx(auVar55,auVar54);
                auVar53 = vmulps_avx512vl(auVar57,auVar114._0_16_);
                auVar57 = vmulps_avx512vl(auVar54,auVar115._0_16_);
                auVar54 = vpmaxsd_avx(auVar53,(undefined1  [16])tray.tnear.field_0);
                auVar57 = vpminsd_avx(auVar57,(undefined1  [16])tray.tfar.field_0);
                uVar11 = vcmpps_avx512vl(auVar54,auVar57,2);
                bVar48 = (byte)uVar11;
              }
              bVar48 = bVar48 & (byte)uVar9;
              sVar35 = sVar42;
              aVar66 = aVar72;
              if (bVar48 != 0) {
                auVar54 = vblendmps_avx512vl((undefined1  [16])auVar113._0_16_,auVar53);
                aVar66._0_4_ = (uint)(bVar48 & 1) * auVar54._0_4_ |
                               (uint)!(bool)(bVar48 & 1) * auVar57._0_4_;
                bVar37 = (bool)(bVar48 >> 1 & 1);
                aVar66._4_4_ = (uint)bVar37 * auVar54._4_4_ | (uint)!bVar37 * auVar57._4_4_;
                bVar37 = (bool)(bVar48 >> 2 & 1);
                aVar66._8_4_ = (uint)bVar37 * auVar54._8_4_ | (uint)!bVar37 * auVar57._8_4_;
                bVar37 = (bool)(bVar48 >> 3 & 1);
                aVar66._12_4_ = (uint)bVar37 * auVar54._12_4_ | (uint)!bVar37 * auVar57._12_4_;
                sVar35 = sVar2;
                if (sVar42 != 8) {
                  pNVar45->ptr = sVar42;
                  pNVar45 = pNVar45 + 1;
                  *paVar41 = aVar72;
                  paVar41 = paVar41 + 1;
                }
              }
              aVar72 = aVar66;
              sVar42 = sVar35;
            }
            if (sVar42 == 8) goto LAB_01d839e9;
            uVar9 = vcmpps_avx512vl((undefined1  [16])aVar72,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar42;
          } while ((byte)uVar46 < (byte)POPCOUNT((int)uVar9));
          pNVar45->ptr = sVar42;
          pNVar45 = pNVar45 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v = aVar72;
          paVar41 = paVar41 + 1;
LAB_01d839e9:
          iVar51 = 4;
        }
        else {
          while (uVar49 != 0) {
            sVar42 = 0;
            for (uVar39 = uVar49; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
              sVar42 = sVar42 + 1;
            }
            uVar49 = uVar49 - 1 & uVar49;
            bVar37 = occluded1(This,bvh,root,sVar42,&pre,ray,&tray,context);
            bVar48 = (byte)(1 << ((uint)sVar42 & 0x1f));
            if (!bVar37) {
              bVar48 = 0;
            }
            local_36d4 = (uint)((byte)local_36d4 | bVar48);
          }
          iVar51 = 3;
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar109 = ZEXT1664(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar110 = ZEXT1664(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar111 = ZEXT1664(auVar57);
          auVar57 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = ZEXT1664(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar113 = ZEXT1664(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar114 = ZEXT1664(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar115 = ZEXT1664(auVar57);
          auVar116 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((byte)local_36d4 != 0xf) {
            auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_36d4 & 1) * auVar57._0_4_ |
                 (uint)!(bool)((byte)local_36d4 & 1) * tray.tfar.field_0.i[0];
            bVar37 = (bool)((byte)(local_36d4 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar37 * auVar57._4_4_ | (uint)!bVar37 * tray.tfar.field_0.i[1];
            bVar37 = (bool)((byte)(local_36d4 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar37 * auVar57._8_4_ | (uint)!bVar37 * tray.tfar.field_0.i[2];
            bVar37 = (bool)((byte)(local_36d4 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar37 * auVar57._12_4_ | (uint)!bVar37 * tray.tfar.field_0.i[3];
            iVar51 = 2;
          }
          if (uVar46 < (uint)POPCOUNT(uVar44)) goto LAB_01d83569;
        }
        if (iVar51 == 3) {
LAB_01d83c2f:
          local_36d4._0_1_ = (byte)local_36d4 & bVar47;
          bVar37 = (bool)((byte)local_36d4 >> 1 & 1);
          bVar4 = (bool)((byte)local_36d4 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)((byte)local_36d4 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_36d4 & 1) * *(int *)(ray + 0x80);
          *(uint *)(ray + 0x84) = (uint)bVar37 * -0x800000 | (uint)!bVar37 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_36d4 >> 3) * -0x800000 |
               (uint)!(bool)((byte)local_36d4 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }